

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpUtils.cpp
# Opt level: O1

HighsLp * withoutSemiVariables
                    (HighsLp *__return_storage_ptr__,HighsLp *lp_,HighsSolution *solution,
                    double primal_feasibility_tolerance)

{
  vector<HighsVarType,_std::allocator<HighsVarType>_> *this;
  long lVar1;
  double *pdVar2;
  int iVar3;
  pointer piVar4;
  pointer pHVar5;
  pointer piVar6;
  pointer pdVar7;
  iterator iVar8;
  pointer pdVar9;
  pointer pdVar10;
  iterator __position;
  bool bVar11;
  HighsVarType HVar12;
  long lVar13;
  double *pdVar14;
  iterator iVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  uint uVar19;
  int iVar20;
  ulong uVar21;
  int iVar22;
  size_type __new_size;
  double dVar23;
  stringstream ss;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0;
  HighsSolution *local_280;
  HighsLp *local_278;
  int local_26c;
  ulong local_268;
  int local_25c;
  vector<double,_std::allocator<double>_> *local_258;
  pointer local_250;
  vector<double,_std::allocator<double>_> *local_248;
  vector<int,_std::allocator<int>_> *local_240;
  vector<double,_std::allocator<double>_> *local_238;
  long local_230;
  int local_224;
  ulong local_220;
  vector<int,_std::allocator<int>_> *local_218;
  vector<double,std::allocator<double>> *local_210;
  vector<double,_std::allocator<double>_> *local_208;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_200;
  pointer local_1f8;
  vector<double,_std::allocator<double>_> *local_1f0;
  vector<double,_std::allocator<double>_> *local_1e8;
  double local_1e0;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_1d8;
  double local_1d0;
  pointer local_1c8;
  pointer local_1c0;
  stringstream local_1b8 [16];
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  local_1e0 = primal_feasibility_tolerance;
  HighsLp::HighsLp(__return_storage_ptr__,lp_);
  iVar20 = __return_storage_ptr__->num_col_;
  lVar18 = (long)iVar20;
  if (lVar18 < 1) {
    local_224 = 0;
  }
  else {
    lVar13 = 0;
    local_224 = 0;
    do {
      local_224 = local_224 +
                  (uint)(((__return_storage_ptr__->integrality_).
                          super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
                          super__Vector_impl_data._M_start[lVar13] & ~kInteger) == kSemiContinuous);
      lVar13 = lVar13 + 1;
    } while (lVar18 != lVar13);
  }
  local_268 = (ulong)(uint)__return_storage_ptr__->num_row_;
  local_240 = &(__return_storage_ptr__->a_matrix_).index_;
  local_230 = (long)local_224;
  __new_size = (long)(__return_storage_ptr__->a_matrix_).start_.
                     super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                     _M_start[lVar18] + local_230 * 2;
  std::vector<int,_std::allocator<int>_>::resize(local_240,__new_size);
  local_248 = &(__return_storage_ptr__->a_matrix_).value_;
  std::vector<double,_std::allocator<double>_>::resize(local_248,__new_size);
  if (0 < iVar20) {
    piVar4 = (__return_storage_ptr__->a_matrix_).start_.
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
    pHVar5 = (__return_storage_ptr__->integrality_).
             super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_280 = (HighsSolution *)
                ((__return_storage_ptr__->a_matrix_).index_.
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_start + -1);
    local_250 = (pointer)((__return_storage_ptr__->a_matrix_).value_.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start + -1);
    lVar13 = lVar18;
    do {
      iVar22 = piVar4[lVar13];
      lVar16 = (long)iVar22;
      piVar4[lVar13] = (int)__new_size;
      uVar21 = (ulong)((int)__new_size - 2);
      if ((pHVar5[lVar13 + -1] & ~kInteger) != kSemiContinuous) {
        uVar21 = __new_size & 0xffffffff;
      }
      __new_size = uVar21;
      if (piVar4[lVar13 + -1] < iVar22) {
        iVar22 = (int)__new_size;
        lVar17 = 0;
        do {
          *(int *)((long)local_280 + (iVar22 + lVar17) * 4) =
               *(pointer)((long)local_280 + (lVar16 + lVar17) * 4);
          *(double *)((long)local_250 + (iVar22 + lVar17) * 8) =
               *(pointer)((long)local_250 + (lVar16 + lVar17) * 8);
          lVar1 = lVar16 + lVar17;
          lVar17 = lVar17 + -1;
        } while ((long)piVar4[lVar13 + -1] < lVar1 + -1);
        __new_size = (size_type)(uint)(iVar22 + (int)lVar17);
      }
      bVar11 = 1 < lVar13;
      lVar13 = lVar13 + -1;
    } while (bVar11);
  }
  if (0 < iVar20) {
    pHVar5 = (__return_storage_ptr__->integrality_).
             super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar4 = (__return_storage_ptr__->a_matrix_).start_.
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
    piVar6 = (__return_storage_ptr__->a_matrix_).index_.
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
    pdVar7 = (__return_storage_ptr__->a_matrix_).value_.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
    lVar13 = 0;
    uVar21 = local_268;
    do {
      if ((pHVar5[lVar13] & ~kInteger) == kSemiContinuous) {
        lVar16 = (long)piVar4[lVar13 + 1];
        iVar22 = (int)uVar21;
        piVar6[lVar16 + -2] = iVar22;
        uVar21 = (ulong)(iVar22 + 2);
        piVar6[lVar16 + -1] = iVar22 + 1;
        pdVar9 = pdVar7 + lVar16 + -2;
        *pdVar9 = 1.0;
        pdVar9[1] = 1.0;
      }
      lVar13 = lVar13 + 1;
    } while (lVar18 != lVar13);
  }
  local_278 = __return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1b8);
  local_220 = local_230 * 2;
  local_1c0 = (__return_storage_ptr__->col_names_).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_1c8 = (__return_storage_ptr__->col_names_).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  local_250 = (__return_storage_ptr__->row_names_).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  local_1f8 = (__return_storage_ptr__->row_names_).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  bVar11 = solution->value_valid;
  local_280 = solution;
  if (0 < (int)local_230 && bVar11 == true) {
    uVar21 = 1;
    if (1 < (int)local_220) {
      uVar21 = local_220 & 0xffffffff;
    }
    do {
      local_2a0._M_dataplus._M_p = (pointer)0x0;
      iVar15._M_current =
           (local_280->row_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar15._M_current ==
          (local_280->row_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  (&solution->row_value,iVar15,(double *)&local_2a0);
      }
      else {
        *iVar15._M_current = 0.0;
        (local_280->row_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar15._M_current + 1;
      }
      uVar19 = (int)uVar21 - 1;
      uVar21 = (ulong)uVar19;
    } while (uVar19 != 0);
  }
  local_230 = lVar18;
  if (0 < iVar20) {
    local_218 = &(__return_storage_ptr__->a_matrix_).start_;
    local_1d8 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                &__return_storage_ptr__->col_names_;
    local_200 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                &__return_storage_ptr__->row_names_;
    this = &__return_storage_ptr__->integrality_;
    local_1e8 = &__return_storage_ptr__->col_cost_;
    local_238 = &__return_storage_ptr__->col_lower_;
    local_1f0 = &__return_storage_ptr__->col_upper_;
    local_208 = &__return_storage_ptr__->row_lower_;
    local_210 = (vector<double,std::allocator<double>> *)&__return_storage_ptr__->row_upper_;
    local_258 = &local_280->col_value;
    lVar18 = 0;
    local_26c = 0;
    local_25c = 0;
    do {
      if (((this->super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>)._M_impl.
           super__Vector_impl_data._M_start[lVar18] & ~kInteger) == kSemiContinuous) {
        local_2a0._M_dataplus._M_p = (pointer)0x0;
        iVar15._M_current =
             (__return_storage_ptr__->col_cost_).super__Vector_base<double,_std::allocator<double>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (iVar15._M_current ==
            (__return_storage_ptr__->col_cost_).super__Vector_base<double,_std::allocator<double>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    (local_1e8,iVar15,(double *)&local_2a0);
        }
        else {
          *iVar15._M_current = 0.0;
          (__return_storage_ptr__->col_cost_).super__Vector_base<double,_std::allocator<double>_>.
          _M_impl.super__Vector_impl_data._M_finish = iVar15._M_current + 1;
        }
        local_2a0._M_dataplus._M_p = (pointer)0x0;
        iVar15._M_current =
             (__return_storage_ptr__->col_lower_).
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_finish;
        if (iVar15._M_current ==
            (__return_storage_ptr__->col_lower_).super__Vector_base<double,_std::allocator<double>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    (local_238,iVar15,(double *)&local_2a0);
        }
        else {
          *iVar15._M_current = 0.0;
          (__return_storage_ptr__->col_lower_).super__Vector_base<double,_std::allocator<double>_>.
          _M_impl.super__Vector_impl_data._M_finish = iVar15._M_current + 1;
        }
        local_2a0._M_dataplus._M_p = (pointer)0x3ff0000000000000;
        iVar15._M_current =
             (__return_storage_ptr__->col_upper_).
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_finish;
        if (iVar15._M_current ==
            (__return_storage_ptr__->col_upper_).super__Vector_base<double,_std::allocator<double>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    (local_1f0,iVar15,(double *)&local_2a0);
        }
        else {
          *iVar15._M_current = 1.0;
          (__return_storage_ptr__->col_upper_).super__Vector_base<double,_std::allocator<double>_>.
          _M_impl.super__Vector_impl_data._M_finish = iVar15._M_current + 1;
        }
        local_2a0._M_dataplus._M_p = (pointer)0x0;
        iVar15._M_current =
             (__return_storage_ptr__->row_lower_).
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_finish;
        if (iVar15._M_current ==
            (__return_storage_ptr__->row_lower_).super__Vector_base<double,_std::allocator<double>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    (local_208,iVar15,(double *)&local_2a0);
        }
        else {
          *iVar15._M_current = 0.0;
          (__return_storage_ptr__->row_lower_).super__Vector_base<double,_std::allocator<double>_>.
          _M_impl.super__Vector_impl_data._M_finish = iVar15._M_current + 1;
        }
        iVar15._M_current =
             (__return_storage_ptr__->row_upper_).
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_finish;
        if (iVar15._M_current ==
            (__return_storage_ptr__->row_upper_).super__Vector_base<double,_std::allocator<double>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                    (local_210,iVar15,(double *)&kHighsInf);
        }
        else {
          *iVar15._M_current = INFINITY;
          (__return_storage_ptr__->row_upper_).super__Vector_base<double,_std::allocator<double>_>.
          _M_impl.super__Vector_impl_data._M_finish = iVar15._M_current + 1;
        }
        if (local_1c8 != local_1c0) {
          local_2a0._M_string_length = 0;
          local_2a0.field_2._M_local_buf[0] = '\0';
          local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
          std::__cxx11::stringbuf::str((string *)(local_1a8 + 8));
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
            operator_delete(local_2a0._M_dataplus._M_p);
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"semi_binary_",0xc);
          std::ostream::operator<<((ostream *)local_1a8,local_25c);
          std::__cxx11::stringbuf::str();
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>(local_1d8,&local_2a0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
            operator_delete(local_2a0._M_dataplus._M_p);
          }
          local_25c = local_25c + 1;
        }
        if (local_250 != local_1f8) {
          local_2a0._M_string_length = 0;
          local_2a0.field_2._M_local_buf[0] = '\0';
          local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
          std::__cxx11::stringbuf::str((string *)(local_1a8 + 8));
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
            operator_delete(local_2a0._M_dataplus._M_p);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"semi_lb_",8);
          std::ostream::operator<<((ostream *)local_1a8,local_26c);
          std::__cxx11::stringbuf::str();
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>(local_200,&local_2a0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
            operator_delete(local_2a0._M_dataplus._M_p);
          }
        }
        local_2a0._M_dataplus._M_p._0_4_ = (int)local_268;
        iVar8._M_current =
             (__return_storage_ptr__->a_matrix_).index_.
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
        ;
        if (iVar8._M_current ==
            (__return_storage_ptr__->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    (local_240,iVar8,(int *)&local_2a0);
        }
        else {
          *iVar8._M_current = (int)local_268;
          (__return_storage_ptr__->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>.
          _M_impl.super__Vector_impl_data._M_finish = iVar8._M_current + 1;
        }
        local_2a0._M_dataplus._M_p =
             (pointer)((ulong)(__return_storage_ptr__->col_lower_).
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start[lVar18] ^ 0x8000000000000000);
        iVar15._M_current =
             (__return_storage_ptr__->a_matrix_).value_.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_finish;
        if (iVar15._M_current ==
            (__return_storage_ptr__->a_matrix_).value_.
            super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    (local_248,iVar15,(double *)&local_2a0);
        }
        else {
          *iVar15._M_current = (double)local_2a0._M_dataplus._M_p;
          (__return_storage_ptr__->a_matrix_).value_.
          super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_finish = iVar15._M_current + 1;
        }
        iVar20 = (int)local_268 + 1;
        if (bVar11 != false) {
          pdVar2 = (local_258->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start + lVar18;
          local_1d0 = *pdVar2;
          if (local_1d0 <= local_1e0) {
            *pdVar2 = 0.0;
            local_2a0._M_dataplus._M_p = (pointer)0x0;
            iVar15._M_current =
                 (local_280->col_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar15._M_current !=
                (local_280->col_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              *iVar15._M_current = 0.0;
              goto LAB_0024915c;
            }
            std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                      (local_258,iVar15,(double *)&local_2a0);
          }
          else {
            pdVar14 = (local_238->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                      super__Vector_impl_data._M_start + lVar18;
            if (*pdVar14 <= local_1d0 && local_1d0 != *pdVar14) {
              pdVar14 = pdVar2;
            }
            *pdVar2 = *pdVar14;
            local_2a0._M_dataplus._M_p = (pointer)0x3ff0000000000000;
            iVar15._M_current =
                 (local_280->col_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar15._M_current ==
                (local_280->col_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                        (local_258,iVar15,(double *)&local_2a0);
            }
            else {
              *iVar15._M_current = 1.0;
LAB_0024915c:
              (local_280->col_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish = iVar15._M_current + 1;
            }
          }
          pdVar7 = (local_258->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          dVar23 = pdVar7[lVar18] - local_1d0;
          if ((dVar23 != 0.0) || (NAN(dVar23))) {
            piVar4 = (local_218->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            iVar22 = piVar4[lVar18];
            lVar13 = (long)iVar22;
            iVar3 = piVar4[lVar18 + 1];
            if (iVar22 < iVar3) {
              pdVar9 = (local_248->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data._M_start;
              piVar4 = (local_240->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_start;
              pdVar10 = (local_280->row_value).super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_start;
              do {
                iVar22 = piVar4[lVar13];
                pdVar10[iVar22] = pdVar9[lVar13] * dVar23 + pdVar10[iVar22];
                lVar13 = lVar13 + 1;
              } while (iVar3 != lVar13);
            }
          }
          dVar23 = *(double *)
                    ((long)pdVar7 +
                    (((long)(__return_storage_ptr__->col_cost_).
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                     (long)(__return_storage_ptr__->col_cost_).
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start) * 0x20000000 + -0x100000000 >> 0x1d));
          pdVar9 = (local_280->row_value).super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          pdVar9[(int)local_268] =
               pdVar7[lVar18] -
               (__return_storage_ptr__->col_lower_).
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start[lVar18] * dVar23;
          pdVar9[iVar20] =
               pdVar7[lVar18] -
               dVar23 * (__return_storage_ptr__->col_upper_).
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar18];
        }
        local_2a0._M_dataplus._M_p = &DAT_fff0000000000000;
        iVar15._M_current =
             (__return_storage_ptr__->row_lower_).
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_finish;
        if (iVar15._M_current ==
            (__return_storage_ptr__->row_lower_).super__Vector_base<double,_std::allocator<double>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    (local_208,iVar15,(double *)&local_2a0);
        }
        else {
          *iVar15._M_current = -INFINITY;
          (__return_storage_ptr__->row_lower_).super__Vector_base<double,_std::allocator<double>_>.
          _M_impl.super__Vector_impl_data._M_finish = iVar15._M_current + 1;
        }
        local_2a0._M_dataplus._M_p = (pointer)0x0;
        iVar15._M_current =
             (__return_storage_ptr__->row_upper_).
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_finish;
        if (iVar15._M_current ==
            (__return_storage_ptr__->row_upper_).super__Vector_base<double,_std::allocator<double>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    ((vector<double,_std::allocator<double>_> *)local_210,iVar15,
                     (double *)&local_2a0);
        }
        else {
          *iVar15._M_current = 0.0;
          (__return_storage_ptr__->row_upper_).super__Vector_base<double,_std::allocator<double>_>.
          _M_impl.super__Vector_impl_data._M_finish = iVar15._M_current + 1;
        }
        if (local_250 != local_1f8) {
          local_2a0._M_string_length = 0;
          local_2a0.field_2._M_local_buf[0] = '\0';
          local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
          std::__cxx11::stringbuf::str((string *)(local_1a8 + 8));
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
            operator_delete(local_2a0._M_dataplus._M_p);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"semi_ub_",8);
          std::ostream::operator<<((ostream *)local_1a8,local_26c);
          std::__cxx11::stringbuf::str();
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>(local_200,&local_2a0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
            operator_delete(local_2a0._M_dataplus._M_p);
          }
          local_26c = local_26c + 1;
        }
        local_2a0._M_dataplus._M_p._0_4_ = iVar20;
        iVar8._M_current =
             (__return_storage_ptr__->a_matrix_).index_.
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
        ;
        if (iVar8._M_current ==
            (__return_storage_ptr__->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    (local_240,iVar8,(int *)&local_2a0);
        }
        else {
          *iVar8._M_current = iVar20;
          (__return_storage_ptr__->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>.
          _M_impl.super__Vector_impl_data._M_finish = iVar8._M_current + 1;
        }
        local_2a0._M_dataplus._M_p =
             (pointer)((ulong)(__return_storage_ptr__->col_upper_).
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start[lVar18] ^ 0x8000000000000000);
        iVar15._M_current =
             (__return_storage_ptr__->a_matrix_).value_.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_finish;
        if (iVar15._M_current ==
            (__return_storage_ptr__->a_matrix_).value_.
            super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    (local_248,iVar15,(double *)&local_2a0);
        }
        else {
          *iVar15._M_current = (double)local_2a0._M_dataplus._M_p;
          (__return_storage_ptr__->a_matrix_).value_.
          super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_finish = iVar15._M_current + 1;
        }
        iVar20 = (int)((ulong)((long)(__return_storage_ptr__->a_matrix_).index_.
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_finish -
                              (long)(__return_storage_ptr__->a_matrix_).index_.
                                    super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start) >> 2);
        local_2a0._M_dataplus._M_p._0_4_ = iVar20;
        iVar8._M_current =
             (__return_storage_ptr__->a_matrix_).start_.
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
        ;
        if (iVar8._M_current ==
            (__return_storage_ptr__->a_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    (local_218,iVar8,(int *)&local_2a0);
        }
        else {
          *iVar8._M_current = iVar20;
          (__return_storage_ptr__->a_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>.
          _M_impl.super__Vector_impl_data._M_finish = iVar8._M_current + 1;
        }
        local_2a0._M_dataplus._M_p._0_1_ = 1;
        __position._M_current =
             (__return_storage_ptr__->integrality_).
             super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (__return_storage_ptr__->integrality_).
            super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<HighsVarType,_std::allocator<HighsVarType>_>::_M_realloc_insert<HighsVarType>
                    (this,__position,(HighsVarType *)&local_2a0);
        }
        else {
          *__position._M_current = kInteger;
          (__return_storage_ptr__->integrality_).
          super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
          super__Vector_impl_data._M_finish = __position._M_current + 1;
        }
        pHVar5 = (this->super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        HVar12 = pHVar5[lVar18];
        if (HVar12 == kSemiContinuous) {
          HVar12 = kContinuous;
LAB_0024948f:
          pHVar5[lVar18] = HVar12;
        }
        else if (HVar12 == kSemiInteger) {
          HVar12 = kInteger;
          goto LAB_0024948f;
        }
        local_268 = (ulong)((int)local_268 + 2);
        (local_238->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
        super__Vector_impl_data._M_start[lVar18] = 0.0;
      }
      lVar18 = lVar18 + 1;
    } while (lVar18 != local_230);
  }
  __return_storage_ptr__->num_col_ = __return_storage_ptr__->num_col_ + local_224;
  __return_storage_ptr__->num_row_ = __return_storage_ptr__->num_row_ + (int)local_220;
  HighsLpMods::clear(&__return_storage_ptr__->mods_);
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

HighsLp withoutSemiVariables(const HighsLp& lp_, HighsSolution& solution,
                             const double primal_feasibility_tolerance) {
  HighsLp lp = lp_;
  HighsInt num_col = lp.num_col_;
  HighsInt num_row = lp.num_row_;
  HighsInt num_semi_variables = 0;
  for (HighsInt iCol = 0; iCol < num_col; iCol++) {
    if (lp.integrality_[iCol] == HighsVarType::kSemiContinuous ||
        lp.integrality_[iCol] == HighsVarType::kSemiInteger)
      num_semi_variables++;
  }
  assert(num_semi_variables);
  // Insert spaces for index/value of new coefficients for
  // semi-variables
  vector<HighsInt>& start = lp.a_matrix_.start_;
  vector<HighsInt>& index = lp.a_matrix_.index_;
  vector<double>& value = lp.a_matrix_.value_;
  HighsInt num_nz = start[num_col];
  HighsInt new_num_nz = num_nz + 2 * num_semi_variables;
  HighsInt new_el = new_num_nz;
  index.resize(new_num_nz);
  value.resize(new_num_nz);
  for (HighsInt iCol = num_col - 1; iCol >= 0; iCol--) {
    HighsInt from_el = start[iCol + 1] - 1;
    start[iCol + 1] = new_el;
    if (lp.integrality_[iCol] == HighsVarType::kSemiContinuous ||
        lp.integrality_[iCol] == HighsVarType::kSemiInteger)
      new_el -= 2;
    for (HighsInt iEl = from_el; iEl >= start[iCol]; iEl--) {
      new_el--;
      index[new_el] = index[iEl];
      value[new_el] = value[iEl];
    }
  }
  assert(new_el == 0);
  // Insert the new coefficients for semi-variables
  HighsInt row_num = num_row;
  for (HighsInt iCol = 0; iCol < num_col; iCol++) {
    if (lp.integrality_[iCol] == HighsVarType::kSemiContinuous ||
        lp.integrality_[iCol] == HighsVarType::kSemiInteger) {
      HighsInt iEl = start[iCol + 1] - 2;
      index[iEl] = row_num++;
      value[iEl] = 1;
      iEl++;
      index[iEl] = row_num++;
      value[iEl] = 1;
    }
  }
  num_nz = start[num_col];
  new_num_nz = num_nz + 2 * num_semi_variables;
  row_num = num_row;
  HighsInt semi_col_num = 0;
  HighsInt semi_row_num = 0;
  // Insert the new variables and their coefficients
  std::stringstream ss;
  const bool has_col_names = (lp.col_names_.size() != 0);
  const bool has_row_names = (lp.row_names_.size() != 0);
  const bool has_solution = solution.value_valid;
  if (has_solution) {
    // Create zeroed row values for the new rows
    assert((HighsInt)solution.row_value.size() == lp_.num_row_);
    for (HighsInt iCol = 0; iCol < 2 * num_semi_variables; iCol++)
      solution.row_value.push_back(0);
    assert((HighsInt)solution.col_value.size() == lp_.num_col_);
    assert((HighsInt)solution.row_value.size() ==
           lp_.num_row_ + 2 * num_semi_variables);
  }
  for (HighsInt iCol = 0; iCol < num_col; iCol++) {
    if (lp.integrality_[iCol] == HighsVarType::kSemiContinuous ||
        lp.integrality_[iCol] == HighsVarType::kSemiInteger) {
      // Add a binary variable with zero cost
      lp.col_cost_.push_back(0);
      lp.col_lower_.push_back(0);
      lp.col_upper_.push_back(1);
      // Complete x - l*y >= 0
      lp.row_lower_.push_back(0);
      lp.row_upper_.push_back(kHighsInf);
      if (has_col_names) {
        // Create a column name
        ss.str(std::string());
        ss << "semi_binary_" << semi_col_num++;
        lp.col_names_.push_back(ss.str());
      }
      if (has_row_names) {
        // Create a row name
        ss.str(std::string());
        ss << "semi_lb_" << semi_row_num;
        lp.row_names_.push_back(ss.str());
      }
      index.push_back(row_num++);
      value.push_back(-lp.col_lower_[iCol]);
      // Accommodate any primal solution
      if (has_solution) {
        // Record the previous solution value so any change can be
        // determined
        const double prev_primal = solution.col_value[iCol];
        if (solution.col_value[iCol] <= primal_feasibility_tolerance) {
          // Currently at or below zero, so binary is 0
          solution.col_value[iCol] = 0;
          solution.col_value.push_back(0);
        } else {
          // Otherwise, solution is at least lower bound, and binary
          // is 1
          solution.col_value[iCol] =
              std::max(lp.col_lower_[iCol], solution.col_value[iCol]);
          solution.col_value.push_back(1);
        }
        const double dl_primal = solution.col_value[iCol] - prev_primal;
        if (dl_primal) {
          // Change in primal value, so update row values. NB start
          // has been extended to incorporate the values in this
          // column for the new rows. Their solution values are zero,
          // but will be set later
          for (HighsInt iEl = start[iCol]; iEl < start[iCol + 1]; iEl++)
            solution.row_value[index[iEl]] += dl_primal * value[iEl];
        }
        const HighsInt new_col = lp.col_cost_.size() - 1;
        const double binary_value = solution.col_value[new_col];
        solution.row_value[row_num - 1] =
            solution.col_value[iCol] - lp.col_lower_[iCol] * binary_value;
        solution.row_value[row_num] =
            solution.col_value[iCol] - lp.col_upper_[iCol] * binary_value;
      }
      // Complete x - u*y <= 0
      lp.row_lower_.push_back(-kHighsInf);
      lp.row_upper_.push_back(0);
      if (has_row_names) {
        // Create a row name
        ss.str(std::string());
        ss << "semi_ub_" << semi_row_num++;
        lp.row_names_.push_back(ss.str());
      }
      index.push_back(row_num++);
      value.push_back(-lp.col_upper_[iCol]);
      // Add the next start
      start.push_back(index.size());
      lp.integrality_.push_back(HighsVarType::kInteger);
      if (lp.integrality_[iCol] == HighsVarType::kSemiContinuous) {
        lp.integrality_[iCol] = HighsVarType::kContinuous;
      } else if (lp.integrality_[iCol] == HighsVarType::kSemiInteger) {
        lp.integrality_[iCol] = HighsVarType::kInteger;
      }
      // Change the lower bound on the semi-variable to zero. Cannot
      // do this earlier, as its original value is used in constraint
      // 0 <= x-l*y
      lp.col_lower_[iCol] = 0;
    }
  }
  num_col += num_semi_variables;
  lp.num_col_ += num_semi_variables;
  lp.num_row_ += 2 * num_semi_variables;
  assert((HighsInt)index.size() == new_num_nz);
  // Clear any modifications inherited from lp_
  lp.mods_.clear();
  return lp;
}